

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.h
# Opt level: O2

CopyConst<char,_ElementType<2UL>_> * __thiscall
absl::lts_20250127::container_internal::internal_layout::
LayoutImpl<std::tuple<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,google::protobuf::compiler::CommandLineInterface::GeneratorInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::compiler::CommandLineInterface::GeneratorInfo>>,256,false>>*,unsigned_int,unsigned_char,absl::lts_20250127::container_internal::map_slot_type<std::__cxx11::string,google::protobuf::compiler::CommandLineInterface::GeneratorInfo>,absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,google::protobuf::compiler::CommandLineInterface::GeneratorInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::compiler::CommandLineInterface::GeneratorInfo>>,256,false>>*>,std::integer_sequence<unsigned_long,1ul,0ul,4ul,4ul,5ul>,std::integer_sequence<unsigned_long>,std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul>,std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul>>
::Pointer<2ul,char>(LayoutImpl<std::tuple<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,google::protobuf::compiler::CommandLineInterface::GeneratorInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::compiler::CommandLineInterface::GeneratorInfo>>,256,false>>*,unsigned_int,unsigned_char,absl::lts_20250127::container_internal::map_slot_type<std::__cxx11::string,google::protobuf::compiler::CommandLineInterface::GeneratorInfo>,absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,google::protobuf::compiler::CommandLineInterface::GeneratorInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::compiler::CommandLineInterface::GeneratorInfo>>,256,false>>*>,std::integer_sequence<unsigned_long,1ul,0ul,4ul,4ul,5ul>,std::integer_sequence<unsigned_long>,std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul>,std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul>>
                    *this,char *p)

{
  if (((ulong)p & 7) == 0) {
    return (CopyConst<char,_ElementType<2UL>_> *)(p + 8);
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/layout.h"
                ,0x1fe,
                "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string<char>, google::protobuf::compiler::CommandLineInterface::GeneratorInfo, std::less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, google::protobuf::compiler::CommandLineInterface::GeneratorInfo>>, 256, false>> *, unsigned int, unsigned char, absl::container_internal::map_slot_type<std::basic_string<char>, google::protobuf::compiler::CommandLineInterface::GeneratorInfo>, absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string<char>, google::protobuf::compiler::CommandLineInterface::GeneratorInfo, std::less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, google::protobuf::compiler::CommandLineInterface::GeneratorInfo>>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 4, 5>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string<char>, google::protobuf::compiler::CommandLineInterface::GeneratorInfo, std::less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, google::protobuf::compiler::CommandLineInterface::GeneratorInfo>>, 256, false>> *, unsigned int, unsigned char, absl::container_internal::map_slot_type<std::basic_string<char>, google::protobuf::compiler::CommandLineInterface::GeneratorInfo>, absl::container_internal::btree_node<absl::container_internal::map_params<std::basic_string<char>, google::protobuf::compiler::CommandLineInterface::GeneratorInfo, std::less<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, google::protobuf::compiler::CommandLineInterface::GeneratorInfo>>, 256, false>> *>, StaticSizeSeq = std::integer_..." /* TRUNCATED STRING LITERAL */
               );
}

Assistant:

CopyConst<Char, ElementType<N>>* Pointer(Char* p) const {
    using C = typename std::remove_const<Char>::type;
    static_assert(
        std::is_same<C, char>() || std::is_same<C, unsigned char>() ||
            std::is_same<C, signed char>(),
        "The argument must be a pointer to [const] [signed|unsigned] char");
    constexpr size_t alignment = Alignment();
    (void)alignment;
    assert(reinterpret_cast<uintptr_t>(p) % alignment == 0);
    return reinterpret_cast<CopyConst<Char, ElementType<N>>*>(p + Offset<N>());
  }